

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

Expression __thiscall cnn::expr::l1_distance(expr *this,Expression *x,Expression *y)

{
  ComputationGraph *arguments;
  undefined8 extraout_RDX;
  Expression EVar1;
  uint local_28;
  uint local_24;
  undefined1 *local_20;
  undefined8 local_18;
  
  local_20 = (undefined1 *)&local_28;
  arguments = x->pg;
  local_28 = (x->i).t;
  local_24 = (y->i).t;
  local_18 = 2;
  ComputationGraph::add_function<cnn::L1Distance>
            ((ComputationGraph *)(this + 8),(initializer_list<cnn::VariableIndex> *)arguments);
  *(ComputationGraph **)this = arguments;
  EVar1._8_8_ = extraout_RDX;
  EVar1.pg = (ComputationGraph *)this;
  return EVar1;
}

Assistant:

Expression l1_distance(const Expression& x, const Expression& y) { return Expression(x.pg, x.pg->add_function<L1Distance>({x.i, y.i})); }